

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.h
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolveOptions::ParallelSolveOptions(ParallelSolveOptions *this)

{
  Distribution *in_RDI;
  Mode in_stack_ffffffffffffffec;
  
  BasicSolveOptions::BasicSolveOptions((BasicSolveOptions *)0x129828);
  Integration::Integration((Integration *)(in_RDI + 2));
  Distribution::Distribution(in_RDI,in_stack_ffffffffffffffec);
  GRestarts::GRestarts((GRestarts *)0x129854);
  Algorithm::Algorithm((Algorithm *)(in_RDI + 6));
  return;
}

Assistant:

ParallelSolveOptions() {}